

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_getBasicIndices(HModel *this,int *bind)

{
  int iVar1;
  reference pvVar2;
  long in_RSI;
  long in_RDI;
  int var;
  int row;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x610); local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_14);
    iVar1 = *pvVar2;
    if (iVar1 < *(int *)(in_RDI + 0x60c)) {
      *(int *)(in_RSI + (long)local_14 * 4) = iVar1;
    }
    else {
      *(int *)(in_RSI + (long)local_14 * 4) = -((iVar1 + 1) - *(int *)(in_RDI + 0x60c));
    }
  }
  return 0;
}

Assistant:

int HModel::util_getBasicIndices(int* bind) {
  for (int row = 0; row < numRow; row++) {
    int var = basicIndex[row];
    if (var >= numCol)
      bind[row] = -(1+var-numCol);
    else
      bind[row] = var;
  }
  return 0;
}